

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O0

char * xmemmem(char *hay,size_t haysize,char *needle,size_t needlesize)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_60;
  uint eqp;
  uint nsum;
  uint hsum;
  char *cand;
  char *np;
  char *hp;
  char *eon;
  char *eoh;
  size_t needlesize_local;
  char *needle_local;
  size_t haysize_local;
  char *hay_local;
  
  if (needlesize == 0) {
    hay_local = (char *)deconst(hay);
  }
  else {
    _nsum = (char *)memchr(hay,(int)*needle,haysize);
    if (_nsum == (char *)0x0) {
      hay_local = (char *)0x0;
    }
    else {
      eqp = (uint)*_nsum;
      local_60 = (uint)*_nsum;
      bVar1 = true;
      np = _nsum;
      for (cand = needle + 1; np = np + 1, np < hay + haysize && cand < needle + needlesize;
          cand = cand + 1) {
        eqp = (int)*np ^ eqp;
        local_60 = (int)*cand ^ local_60;
        bVar1 = (bool)(*np == *cand & bVar1);
      }
      if (cand < needle + needlesize) {
        hay_local = (char *)0x0;
      }
      else if (bVar1) {
        hay_local = (char *)deconst(_nsum);
      }
      else {
        for (; np < hay + haysize; np = np + 1) {
          pcVar3 = _nsum + 1;
          eqp = (int)*np ^ (int)*_nsum ^ eqp;
          if ((eqp == local_60) && (iVar2 = memcmp(pcVar3,needle,needlesize - 1), iVar2 == 0)) {
            pcVar3 = (char *)deconst(pcVar3);
            return pcVar3;
          }
          _nsum = pcVar3;
        }
        hay_local = (char *)0x0;
      }
    }
  }
  return hay_local;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t haysize,
	const char *needle, const size_t needlesize)
{
	const char *const eoh = hay + haysize;
	const char *const eon = needle + needlesize;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (needlesize == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *needle, haysize)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = needle + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NEEDLESIZE + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NEEDLESIZE - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, needle, needlesize - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}